

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::ByteData::Push(ByteData *this,ByteData256 *back_insert_data)

{
  size_type sVar1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> insert_bytes;
  ByteData256 *back_insert_data_local;
  ByteData *this_local;
  
  insert_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)back_insert_data;
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,back_insert_data);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,sVar1 + 8 + sVar2);
  __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      (in_stack_ffffffffffffff68);
  __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     (in_stack_ffffffffffffff68);
  __result = ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (&this->data_);
  ::std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,__result);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__result.container);
  return;
}

Assistant:

void ByteData::Push(const ByteData256& back_insert_data) {
  std::vector<uint8_t> insert_bytes = back_insert_data.GetBytes();
  data_.reserve(data_.size() + insert_bytes.size() + 8);
  std::copy(
      insert_bytes.begin(), insert_bytes.end(), std::back_inserter(data_));
}